

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O3

string * __thiscall
kws::Parser::FindPreviousWord
          (string *__return_storage_ptr__,Parser *this,size_t pos,bool withComments,string *buffer)

{
  pointer pcVar1;
  byte bVar2;
  char cVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  string stream;
  string store;
  undefined1 *local_70 [2];
  undefined1 local_60 [16];
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  pcVar1 = (buffer->_M_dataplus)._M_p;
  local_70[0] = local_60;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_70,pcVar1,pcVar1 + buffer->_M_string_length);
  if (buffer->_M_string_length == 0) {
    std::__cxx11::string::_M_assign((string *)local_70);
    if (withComments) {
      std::__cxx11::string::_M_assign((string *)local_70);
    }
  }
  cVar3 = local_70[0][pos];
  if (cVar3 == ' ') {
    bVar6 = false;
  }
  else {
    do {
      if ((pos == 0) || (cVar3 == '\r')) goto LAB_00121ddd;
      cVar3 = local_70[0][pos - 1];
      pos = pos - 1;
    } while (cVar3 != ' ');
    cVar3 = ' ';
LAB_00121ddd:
    bVar6 = cVar3 == '\r';
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  lVar4 = pos - (byte)(1 < pos & bVar6);
  if (lVar4 != -1) {
    bVar2 = 0;
    do {
      cVar3 = local_70[0][lVar4];
      if (cVar3 == '\n') {
LAB_00121e3d:
        bVar6 = (bool)(bVar2 ^ 1);
      }
      else if (cVar3 == '\r') {
        bVar6 = true;
      }
      else {
        if (cVar3 == ' ') goto LAB_00121e3d;
        pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
        local_50[0] = local_40;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_50,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
        std::__cxx11::string::_M_replace_aux
                  ((ulong)__return_storage_ptr__,0,__return_storage_ptr__->_M_string_length,'\x01');
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_50[0]);
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        bVar6 = true;
        bVar2 = 1;
      }
      bVar5 = lVar4 != 0;
      lVar4 = lVar4 + -1;
    } while ((bVar5) && (bVar6));
  }
  if (local_70[0] != local_60) {
    operator_delete(local_70[0]);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Parser::FindPreviousWord(size_t pos,bool withComments,std::string buffer) const
{
  std::string stream = buffer;
  if (buffer.empty()) {
    stream = m_BufferNoComment;
    if(withComments)
      {
      stream = m_Buffer;
      }
  }

  size_t i=pos;

  while(stream[i] != ' ' && stream[i] != '\r' && i>0)
    {
    i--;
    }

  if(stream[i] == '\r' && i>1)
    {
    i--;
    }

  bool inWord = true;
  bool first = false;
  std::string ivar = "";
  while(i != std::string::npos && inWord)
    {
    if(stream[i] != ' ' && stream[i] != '\n' && stream[i] != '\r')
      {
      std::string store = ivar;
      ivar = stream[i];
      ivar += store;
      inWord = true;
      first = true;
      }
    else // we have a space
      {
      if(stream[i] == '\r')
        {
        // do nothing
        }
      else if(first)
        {
        inWord = false;
        }
      }
    i--;
    }
  return ivar;
}